

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O1

string * __thiscall
libcellml::Importer::ImporterImpl::modelUrl_abi_cxx11_
          (string *__return_storage_ptr__,ImporterImpl *this,ModelPtr *model)

{
  element_type *peVar1;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_header *p_Var3;
  bool bVar4;
  
  p_Var2 = (this->mLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->mLibrary)._M_t._M_impl.super__Rb_tree_header;
  bVar4 = (_Rb_tree_header *)p_Var2 == p_Var3;
  if (!bVar4) {
    peVar1 = (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    do {
      if (*(element_type **)(p_Var2 + 2) == peVar1) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,*(long *)(p_Var2 + 1),
                   (long)&(p_Var2[1]._M_parent)->_M_color + *(long *)(p_Var2 + 1));
        if (!bVar4) {
          return __return_storage_ptr__;
        }
        break;
      }
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
      bVar4 = (_Rb_tree_header *)p_Var2 == p_Var3;
    } while (!bVar4);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,libcellml::ORIGIN_MODEL_REF_abi_cxx11_,
             DAT_002fab48 + libcellml::ORIGIN_MODEL_REF_abi_cxx11_);
  return __return_storage_ptr__;
}

Assistant:

std::string Importer::ImporterImpl::modelUrl(const ModelPtr &model) const
{
    for (const auto &entry : mLibrary) {
        if (entry.second == model) {
            return entry.first;
        }
    }

    return ORIGIN_MODEL_REF;
}